

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_> __thiscall
cmList::TransformSelector::NewFOR
          (TransformSelector *this,vector<long,_std::allocator<long>_> *indexes)

{
  size_type sVar1;
  transform_error *ptVar2;
  reference pvVar3;
  reference __args_2;
  unique_ptr<(anonymous_namespace)::TransformSelectorFor,_std::default_delete<(anonymous_namespace)::TransformSelectorFor>_>
  local_80;
  undefined1 local_72;
  allocator<char> local_71;
  string local_70;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  vector<long,_std::allocator<long>_> *local_18;
  vector<long,_std::allocator<long>_> *indexes_local;
  
  local_18 = indexes;
  indexes_local = (vector<long,_std::allocator<long>_> *)this;
  sVar1 = std::vector<long,_std::allocator<long>_>::size(indexes);
  if ((sVar1 < 2) || (sVar1 = std::vector<long,_std::allocator<long>_>::size(local_18), 3 < sVar1))
  {
    local_4d = 1;
    ptVar2 = (transform_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"sub-command TRANSFORM, selector FOR expects 2 or 3 arguments",
               &local_39);
    transform_error::transform_error(ptVar2,&local_38);
    local_4d = 0;
    __cxa_throw(ptVar2,&transform_error::typeinfo,transform_error::~transform_error);
  }
  sVar1 = std::vector<long,_std::allocator<long>_>::size(local_18);
  if ((sVar1 == 3) &&
     (pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](local_18,2), *pvVar3 < 0)) {
    local_72 = 1;
    ptVar2 = (transform_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "sub-command TRANSFORM, selector FOR expects positive numeric value for <step>.",
               &local_71);
    transform_error::transform_error(ptVar2,&local_70);
    local_72 = 0;
    __cxa_throw(ptVar2,&transform_error::typeinfo,transform_error::~transform_error);
  }
  pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](local_18,0);
  __args_2 = std::vector<long,_std::allocator<long>_>::operator[](local_18,1);
  sVar1 = std::vector<long,_std::allocator<long>_>::size(local_18);
  if (sVar1 == 3) {
    std::vector<long,_std::allocator<long>_>::operator[](local_18,2);
  }
  std::make_unique<(anonymous_namespace)::TransformSelectorFor,long&,long&,long>
            ((long *)&local_80,pvVar3,__args_2);
  std::unique_ptr<cmList::TransformSelector,std::default_delete<cmList::TransformSelector>>::
  unique_ptr<(anonymous_namespace)::TransformSelectorFor,std::default_delete<(anonymous_namespace)::TransformSelectorFor>,void>
            ((unique_ptr<cmList::TransformSelector,std::default_delete<cmList::TransformSelector>> *
             )this,&local_80);
  std::
  unique_ptr<(anonymous_namespace)::TransformSelectorFor,_std::default_delete<(anonymous_namespace)::TransformSelectorFor>_>
  ::~unique_ptr(&local_80);
  return (__uniq_ptr_data<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>,_true,_true>
          )(__uniq_ptr_data<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmList::TransformSelector> cmList::TransformSelector::NewFOR(
  std::vector<index_type>&& indexes)
{
  if (indexes.size() < 2 || indexes.size() > 3) {
    throw transform_error("sub-command TRANSFORM, selector FOR "
                          "expects 2 or 3 arguments");
  }
  if (indexes.size() == 3 && indexes[2] < 0) {
    throw transform_error("sub-command TRANSFORM, selector FOR expects "
                          "positive numeric value for <step>.");
  }

  return cm::make_unique<TransformSelectorFor>(
    indexes[0], indexes[1], indexes.size() == 3 ? indexes[2] : 1);
}